

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O1

void __thiscall
kj::HashIndex<kj::HashMap<int,kj::StringPtr>::Callbacks>::
move<kj::HashMap<int,kj::StringPtr>::Entry,int&>
          (HashIndex<kj::HashMap<int,kj::StringPtr>::Callbacks> *this,
          ArrayPtr<kj::HashMap<int,_kj::StringPtr>::Entry> table,size_t oldPos,size_t newPos,
          int *params)

{
  long lVar1;
  char *pcVar2;
  size_t sVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  String SStack_28;
  
  uVar4 = *params * 0x8000 + ~*params;
  uVar4 = (uVar4 >> 0xc ^ uVar4) * 5;
  uVar4 = (uVar4 >> 4 ^ uVar4) * 0x809;
  lVar1 = *(long *)(this + 0x10);
  uVar6 = (ulong)((int)*(ulong *)(this + 0x18) - 1U & (uVar4 >> 0x10 ^ uVar4));
  iVar5 = (int)oldPos + 2;
  iVar8 = *(int *)(lVar1 + 4 + uVar6 * 8);
  if (iVar5 != iVar8) {
    do {
      if (iVar8 == 0) {
        if (_::Debug::minSeverity < 3) {
          getStackTrace();
          _::Debug::log<char_const(&)[264],kj::String>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
                     ,(char  [7])0x39,ERROR,
                     "\"HashIndex detected hash table inconsistency. This can happen if you create a kj::Table \" \"with a hash index and you modify the rows in the table post-indexing in a way that would \" \"change their hash. This is a serious bug which will lead to undefined behavior.\" \"\\nstack: \", kj::getStackTrace()"
                     ,(char (*) [264])
                      "HashIndex detected hash table inconsistency. This can happen if you create a kj::Table with a hash index and you modify the rows in the table post-indexing in a way that would change their hash. This is a serious bug which will lead to undefined behavior.\nstack: "
                     ,&SStack_28);
          sVar3 = SStack_28.content.size_;
          pcVar2 = SStack_28.content.ptr;
          if (SStack_28.content.ptr != (char *)0x0) {
            SStack_28.content.ptr = (char *)0x0;
            SStack_28.content.size_ = 0;
            (**(SStack_28.content.disposer)->_vptr_ArrayDisposer)
                      (SStack_28.content.disposer,pcVar2,1,sVar3,sVar3,0);
          }
        }
        return;
      }
      uVar7 = uVar6 + 1;
      uVar6 = uVar7 & 0xffffffff;
      if (uVar7 == *(ulong *)(this + 0x18)) {
        uVar6 = 0;
      }
      iVar8 = *(int *)(lVar1 + 4 + uVar6 * 8);
    } while (iVar5 != iVar8);
  }
  *(int *)(lVar1 + 4 + uVar6 * 8) = (int)newPos + 2;
  return;
}

Assistant:

inline uint hashCode(T&& value) { return _::HASHCODER * kj::fwd<T>(value); }